

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

int IoCommandWritePla(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Io_FileType_t FileType;
  char *pcVar3;
  int fUseMoPla;
  int c;
  char *pFileName;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  while (iVar2 = Extra_UtilGetopt(argc,argv,"mh"), iVar2 != -1) {
    if ((iVar2 == 0x68) || (iVar2 != 0x6d)) goto LAB_0033ba82;
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (pAbc->pNtkCur == (Abc_Ntk_t *)0x0) {
    fprintf((FILE *)pAbc->Out,"Empty network.\n");
    pAbc_local._4_4_ = 0;
  }
  else if (argc == globalUtilOptind + 1) {
    FileType = IO_FILE_PLA;
    if (bVar1) {
      FileType = IO_FILE_MOPLA;
    }
    Io_Write(pAbc->pNtkCur,argv[globalUtilOptind],FileType);
    pAbc_local._4_4_ = 0;
  }
  else {
LAB_0033ba82:
    fprintf((FILE *)pAbc->Err,"usage: write_pla [-mh] <file>\n");
    fprintf((FILE *)pAbc->Err,"\t         writes the collapsed network into a PLA file\n");
    pcVar3 = "no";
    if (bVar1) {
      pcVar3 = "yes";
    }
    fprintf((FILE *)pAbc->Err,"\t-m     : toggle writing multi-output PLA [default = %s]\n",pcVar3);
    fprintf((FILE *)pAbc->Err,"\t-h     : print the help massage\n");
    fprintf((FILE *)pAbc->Err,"\tfile   : the name of the file to write\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int IoCommandWritePla( Abc_Frame_t * pAbc, int argc, char **argv )
{
    char * pFileName;
    int c, fUseMoPla = 0;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "mh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'm':
                fUseMoPla ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( pAbc->pNtkCur == NULL )
    {
        fprintf( pAbc->Out, "Empty network.\n" );
        return 0;
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the output file name
    pFileName = argv[globalUtilOptind];
    // call the corresponding file writer
    Io_Write( pAbc->pNtkCur, pFileName, fUseMoPla ? IO_FILE_MOPLA : IO_FILE_PLA );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: write_pla [-mh] <file>\n" );
    fprintf( pAbc->Err, "\t         writes the collapsed network into a PLA file\n" );
    fprintf( pAbc->Err, "\t-m     : toggle writing multi-output PLA [default = %s]\n", fUseMoPla? "yes":"no" );
    fprintf( pAbc->Err, "\t-h     : print the help massage\n" );
    fprintf( pAbc->Err, "\tfile   : the name of the file to write\n" );
    return 1;
}